

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

optional<signed_char>
trial::dynamic::convert::
overloader<boost::optional<signed_char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
::into(basic_variable<std::allocator<char>_> *data,error_code *error)

{
  bool bVar1;
  error_code eVar2;
  undefined4 uStack_34;
  type_conflict local_22 [2];
  error_code *local_20;
  error_code *error_local;
  basic_variable<std::allocator<char>_> *data_local;
  
  local_20 = error;
  error_local = (error_code *)data;
  std::error_code::clear(error);
  bVar1 = basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)error_local);
  if (bVar1) {
    boost::optional<signed_char>::optional((optional<signed_char> *)((long)&data_local + 6));
  }
  else {
    bVar1 = basic_variable<std::allocator<char>_>::is<signed_char>
                      ((basic_variable<std::allocator<char>_> *)error_local);
    if (bVar1) {
      local_22[0] = basic_variable<std::allocator<char>_>::value<signed_char>
                              ((basic_variable<std::allocator<char>_> *)error_local,local_20);
      boost::optional<signed_char>::optional
                ((optional<signed_char> *)((long)&data_local + 6),local_22);
    }
    else {
      eVar2 = make_error_code(incompatible_type);
      *(ulong *)local_20 = CONCAT44(uStack_34,eVar2._M_value);
      local_20->_M_cat = eVar2._M_cat;
      boost::optional<signed_char>::optional((optional<signed_char> *)((long)&data_local + 6));
    }
  }
  return (optional<signed_char>)data_local._6_2_;
}

Assistant:

static boost::optional<T> into(const basic_variable<Allocator>& data,
                                   std::error_code& error)
    {
        error.clear();

        if (data.template is<nullable>())
            return boost::none;

        if (data.template is<T>())
            return data.template value<T>(error);

        error = dynamic::make_error_code(incompatible_type);
        return {};
    }